

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<int> __thiscall vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  SharedPtrStateBase *extraout_RDX;
  undefined8 *in_RSI;
  ExprP<int> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<int>_> local_18;
  
  local_18.m_ptr = (Expr<int> *)*in_RSI;
  local_18.m_state = (SharedPtrStateBase *)in_RSI[1];
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  exprP<int>((shaderexecutor *)this,&local_18);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<int>_>::release(&local_18);
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_ptr =
       (Expr<int> *)this;
  return (ExprP<int>)
         EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }